

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

idx_t duckdb::ExpressionHeuristics::ExpressionCost(PhysicalType return_type,idx_t multiplier)

{
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,return_type) - 0xbU < 2) {
    multiplier = multiplier * 2;
  }
  else if (CONCAT31(in_register_00000039,return_type) == 200) {
    return multiplier * 5;
  }
  return multiplier;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(PhysicalType return_type, idx_t multiplier) {
	// TODO: ajust values according to benchmark results
	switch (return_type) {
	case PhysicalType::VARCHAR:
		return 5 * multiplier;
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return 2 * multiplier;
	default:
		return 1 * multiplier;
	}
}